

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h263d_api.c
# Opt level: O3

MPP_RET h263d_init(void *dec,ParserCfg *cfg)

{
  MppBufSlots pvVar1;
  MPP_RET MVar2;
  void *data;
  char *fmt;
  MppPacket task_pkt;
  H263dParser parser;
  MppPacket local_30;
  H263dParser local_28;
  
  local_28 = (H263dParser)0x0;
  local_30 = (MppPacket)0x0;
  if (dec == (void *)0x0) {
    _mpp_log_l(2,"h263d_api","found NULL intput dec %p cfg %p\n","h263d_init",0,cfg);
    MVar2 = MPP_ERR_NULL_PTR;
  }
  else {
    data = mpp_osal_malloc("h263d_init",0x10000);
    if (data == (void *)0x0) {
      _mpp_log_l(2,"h263d_api","failed to malloc stream buffer size %d\n","h263d_init",0x10000);
      MVar2 = MPP_ERR_MALLOC;
    }
    else {
      MVar2 = mpp_packet_init(&local_30,data,0x10000);
      if (MVar2 == MPP_OK) {
        mpp_packet_set_pos(local_30,data);
        mpp_packet_set_length(local_30,0);
        MVar2 = mpp_h263_parser_init(&local_28,cfg->frame_slots);
        if (MVar2 == MPP_OK) {
          pvVar1 = cfg->packet_slots;
          *(MppBufSlots *)dec = cfg->frame_slots;
          *(MppBufSlots *)((long)dec + 8) = pvVar1;
          *(MppDecCfgSet **)((long)dec + 0x10) = cfg->cfg;
          *(void **)((long)dec + 0x18) = data;
          *(undefined8 *)((long)dec + 0x20) = 0x10000;
          *(MppPacket *)((long)dec + 0x28) = local_30;
          *(H263dParser *)((long)dec + 0x40) = local_28;
          return MPP_OK;
        }
        fmt = "failed to init parser\n";
      }
      else {
        fmt = "failed to create mpp_packet for task\n";
      }
      _mpp_log_l(2,"h263d_api",fmt,"h263d_init");
      if (local_30 != (MppPacket)0x0) {
        mpp_packet_deinit(&local_30);
      }
      mpp_osal_free("h263d_init",data);
    }
  }
  return MVar2;
}

Assistant:

MPP_RET h263d_init(void *dec, ParserCfg *cfg)
{
    H263dParser parser = NULL;
    MppPacket task_pkt = NULL;
    H263dCtx *p;
    MPP_RET ret;
    RK_U8 *stream;
    size_t stream_size = h263d_INIT_STREAM_SIZE;

    if (NULL == dec) {
        mpp_err_f("found NULL intput dec %p cfg %p\n", dec, cfg);
        return MPP_ERR_NULL_PTR;
    }

    stream = mpp_malloc_size(RK_U8, stream_size);
    if (NULL == stream) {
        mpp_err_f("failed to malloc stream buffer size %d\n", stream_size);
        return MPP_ERR_MALLOC;
    }

    ret = mpp_packet_init(&task_pkt, stream, stream_size);
    if (ret) {
        mpp_err_f("failed to create mpp_packet for task\n");
        goto ERR_RET;
    }

    // reset task packet length to zero
    // NOTE: set length must after set pos
    mpp_packet_set_pos(task_pkt, stream);
    mpp_packet_set_length(task_pkt, 0);

    ret = mpp_h263_parser_init(&parser, cfg->frame_slots);
    if (ret) {
        mpp_err_f("failed to init parser\n");
        goto ERR_RET;
    }

    p = (H263dCtx *)dec;
    p->frame_slots  = cfg->frame_slots;
    p->packet_slots = cfg->packet_slots;
    p->cfg          = cfg->cfg;
    p->stream       = stream;
    p->stream_size  = stream_size;
    p->task_pkt     = task_pkt;
    p->parser       = parser;

    return MPP_OK;
ERR_RET:
    if (task_pkt) {
        mpp_packet_deinit(&task_pkt);
    }
    if (stream) {
        mpp_free(stream);
        stream = NULL;
    }
    return ret;
}